

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_handshake_step(mbedtls_ssl_context *ssl)

{
  int local_1c;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  local_1c = -0x7080;
  if ((ssl == (mbedtls_ssl_context *)0x0) || (ssl->conf == (mbedtls_ssl_config *)0x0)) {
    ssl_local._4_4_ = -0x7100;
  }
  else {
    if ((*(uint *)&ssl->conf->field_0x164 & 1) == 0) {
      local_1c = mbedtls_ssl_handshake_client_step(ssl);
    }
    if ((*(uint *)&ssl->conf->field_0x164 & 1) == 1) {
      local_1c = mbedtls_ssl_handshake_server_step(ssl);
    }
    ssl_local._4_4_ = local_1c;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_handshake_step( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;

    if( ssl == NULL || ssl->conf == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
        ret = mbedtls_ssl_handshake_client_step( ssl );
#endif
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
        ret = mbedtls_ssl_handshake_server_step( ssl );
#endif

    return( ret );
}